

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O2

_Bool square_isarrivable(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  square *psVar2;
  
  psVar2 = square(c,grid);
  if (((psVar2->mon == 0) && (_Var1 = square_isplayertrap(c,grid), !_Var1)) &&
     (_Var1 = square_iswebbed(c,grid), !_Var1)) {
    _Var1 = square_isfloor(c,grid);
    if (_Var1) {
      return true;
    }
    _Var1 = square_isstairs(c,grid);
    return _Var1;
  }
  return false;
}

Assistant:

bool square_isarrivable(struct chunk *c, struct loc grid) {
	if (square(c, grid)->mon) return false;
	if (square_isplayertrap(c, grid)) return false;
	if (square_iswebbed(c, grid)) return false;
	if (square_isfloor(c, grid)) return true;
	if (square_isstairs(c, grid)) return true;
	// maybe allow open doors or suchlike?
	return false;
}